

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O2

SUNErrCode SUNContext_ClearErrHandlers(SUNContext sunctx)

{
  if (sunctx == (SUNContext)0x0) {
    return -0x26f5;
  }
  while (sunctx->err_handler != (SUNErrHandler_conflict)0x0) {
    SUNContext_PopErrHandler(sunctx);
  }
  return 0;
}

Assistant:

SUNErrCode SUNContext_ClearErrHandlers(SUNContext sunctx)
{
  if (!sunctx) { return SUN_ERR_SUNCTX_CORRUPT; }

  SUNFunctionBegin(sunctx);
  while (sunctx->err_handler != NULL)
  {
    SUNCheckCall(SUNContext_PopErrHandler(sunctx));
  }
  return SUN_SUCCESS;
}